

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t cab_skip_sfx(archive_read *a)

{
  archive *paVar1;
  archive *in_RDI;
  wchar_t next;
  char *h;
  ssize_t window;
  ssize_t bytes;
  size_t skip;
  char *q;
  char *p;
  uint in_stack_ffffffffffffffb8;
  wchar_t in_stack_ffffffffffffffbc;
  archive_read *in_stack_ffffffffffffffc0;
  ulong local_38;
  long local_30;
  archive_read *local_18;
  
  local_38 = 0x1000;
  do {
    while (in_stack_ffffffffffffffc0 =
                (archive_read *)
                __archive_read_ahead
                          (in_stack_ffffffffffffffc0,
                           CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                           (ssize_t *)0x252156), in_stack_ffffffffffffffc0 == (archive_read *)0x0) {
      local_38 = (long)local_38 >> 1;
      if (local_38 < 0x80) {
        archive_set_error(in_RDI,0x54,"Couldn\'t find out CAB header");
        return L'\xffffffe2';
      }
    }
    paVar1 = &in_stack_ffffffffffffffc0->archive;
    for (local_18 = in_stack_ffffffffffffffc0;
        &(local_18->archive).vtable < (undefined1 *)((long)&paVar1->magic + local_30);
        local_18 = (archive_read *)
                   ((long)&(local_18->archive).magic + (long)in_stack_ffffffffffffffbc)) {
      in_stack_ffffffffffffffbc = find_cab_magic((char *)local_18);
      if (in_stack_ffffffffffffffbc == L'\0') {
        __archive_read_consume(in_stack_ffffffffffffffc0,(ulong)in_stack_ffffffffffffffb8);
        return L'\0';
      }
    }
    __archive_read_consume
              (in_stack_ffffffffffffffc0,
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  } while( true );
}

Assistant:

static int
cab_skip_sfx(struct archive_read *a)
{
	const char *p, *q;
	size_t skip;
	ssize_t bytes, window;

	window = 4096;
	for (;;) {
		const char *h = __archive_read_ahead(a, window, &bytes);
		if (h == NULL) {
			/* Remaining size are less than window. */
			window >>= 1;
			if (window < 128) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Couldn't find out CAB header");
				return (ARCHIVE_FATAL);
			}
			continue;
		}
		p = h;
		q = p + bytes;

		/*
		 * Scan ahead until we find something that looks
		 * like the cab header.
		 */
		while (p + 8 < q) {
			int next;
			if ((next = find_cab_magic(p)) == 0) {
				skip = p - h;
				__archive_read_consume(a, skip);
				return (ARCHIVE_OK);
			}
			p += next;
		}
		skip = p - h;
		__archive_read_consume(a, skip);
	}
}